

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvscsu.cpp
# Opt level: O1

void useDynamicWindow(SCSUData *scsu,int8_t window)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (int)scsu->nextWindowUseIndex;
  do {
    bVar1 = iVar3 < 1;
    iVar3 = iVar3 + -1;
    if (bVar1) {
      iVar3 = 7;
    }
  } while (scsu->windowUse[iVar3] != window);
  iVar2 = iVar3 + 1;
  if (iVar3 + 1 == 8) {
    iVar2 = 0;
  }
  iVar4 = iVar3;
  if (iVar2 != scsu->nextWindowUseIndex) {
    do {
      iVar3 = iVar2;
      iVar2 = iVar3 + 1;
      if (iVar3 + 1 == 8) {
        iVar2 = 0;
      }
      scsu->windowUse[iVar4] = scsu->windowUse[iVar3];
      iVar4 = iVar3;
    } while (iVar2 != scsu->nextWindowUseIndex);
  }
  scsu->windowUse[iVar3] = window;
  return;
}

Assistant:

static void
useDynamicWindow(SCSUData *scsu, int8_t window) {
    /*
     * move the existing window, which just became the most recently used one,
     * up in windowUse[] to nextWindowUseIndex-1
     */

    /* first, find the index of the window - backwards to favor the more recently used windows */
    int i, j;

    i=scsu->nextWindowUseIndex;
    do {
        if(--i<0) {
            i=7;
        }
    } while(scsu->windowUse[i]!=window);

    /* now copy each windowUse[i+1] to [i] */
    j=i+1;
    if(j==8) {
        j=0;
    }
    while(j!=scsu->nextWindowUseIndex) {
        scsu->windowUse[i]=scsu->windowUse[j];
        i=j;
        if(++j==8) { j=0; }
    }

    /* finally, set the window into the most recently used index */
    scsu->windowUse[i]=window;
}